

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

void __thiscall restincurl::RequestBuilder::Build(RequestBuilder *this)

{
  RequestType RVar1;
  _Head_base<0UL,_restincurl::Request_*,_false> _Var2;
  _Manager_type p_Var3;
  ostringstream *this_00;
  LogManager *pLVar4;
  CURLoption local_1bc;
  _Any_data local_1b8;
  _Manager_type local_1a8;
  _Invoker_type local_1a0;
  Log local_198;
  
  if (this->is_built_ == false) {
    if (this->have_data_in_ == false) {
      StoreData<std::__cxx11::string>
                (this,&((this->request_)._M_t.
                        super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>
                        .super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl)->
                       default_data_buffer_);
    }
    if (this->have_data_out_ == true) {
      local_1bc = CURLOPT_UPLOAD;
      local_198._0_8_ = (char *)0x1;
      Options::Set<long>((this->options_)._M_t.
                         super___uniq_ptr_impl<restincurl::Options,_std::default_delete<restincurl::Options>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_restincurl::Options_*,_std::default_delete<restincurl::Options>_>
                         .super__Head_base<0UL,_restincurl::Options_*,_false>._M_head_impl,
                         &local_1bc,(long *)&local_198);
    }
    if (-1 < this->request_timeout_) {
      local_198.level_ = 0x9b;
      Options::Set<long>((this->options_)._M_t.
                         super___uniq_ptr_impl<restincurl::Options,_std::default_delete<restincurl::Options>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_restincurl::Options_*,_std::default_delete<restincurl::Options>_>
                         .super__Head_base<0UL,_restincurl::Options_*,_false>._M_head_impl,
                         &local_198.level_,&this->request_timeout_);
    }
    if (-1 < this->connect_timeout_) {
      local_198.level_ = 0x9c;
      Options::Set<long>((this->options_)._M_t.
                         super___uniq_ptr_impl<restincurl::Options,_std::default_delete<restincurl::Options>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_restincurl::Options_*,_std::default_delete<restincurl::Options>_>
                         .super__Head_base<0UL,_restincurl::Options_*,_false>._M_head_impl,
                         &local_198.level_,&this->connect_timeout_);
    }
    _Var2._M_head_impl =
         (this->request_)._M_t.
         super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>._M_t.
         super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
         super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl;
    if ((_Var2._M_head_impl)->headers_ != (headers_t)0x0) {
      local_198.level_ = 0x2727;
      Options::Set<curl_slist*>
                ((this->options_)._M_t.
                 super___uniq_ptr_impl<restincurl::Options,_std::default_delete<restincurl::Options>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_restincurl::Options_*,_std::default_delete<restincurl::Options>_>
                 .super__Head_base<0UL,_restincurl::Options_*,_false>._M_head_impl,&local_198.level_
                 ,&(_Var2._M_head_impl)->headers_);
    }
    local_1bc = CURLOPT_URL;
    local_198._0_8_ = (this->url_)._M_dataplus._M_p;
    Options::Set<char_const*>
              ((this->options_)._M_t.
               super___uniq_ptr_impl<restincurl::Options,_std::default_delete<restincurl::Options>_>
               ._M_t.
               super__Tuple_impl<0UL,_restincurl::Options_*,_std::default_delete<restincurl::Options>_>
               .super__Head_base<0UL,_restincurl::Options_*,_false>._M_head_impl,&local_1bc,
               (char **)&local_198);
    pLVar4 = logfault::LogManager::Instance();
    if (((pLVar4->handlers_).
         super__Vector_base<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (pLVar4->handlers_).
         super__Vector_base<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>,_std::allocator<std::unique_ptr<logfault::Handler,_std::default_delete<logfault::Handler>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) && (4 < (int)pLVar4->level_)) {
      this_00 = (ostringstream *)((long)&local_198 + 8);
      local_198.level_ = 5;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"restincurl: ",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Preparing connect to: ",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,(this->url_)._M_dataplus._M_p,(this->url_)._M_string_length);
      logfault::Log::~Log(&local_198);
    }
    _Var2._M_head_impl =
         (this->request_)._M_t.
         super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>._M_t.
         super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
         super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl;
    RVar1 = this->request_type_;
    local_1b8._M_unused._M_object = (void *)0x0;
    local_1b8._8_8_ = 0;
    local_1a8 = (_Manager_type)0x0;
    local_1a0 = (this->completion_)._M_invoker;
    p_Var3 = (this->completion_).super__Function_base._M_manager;
    if (p_Var3 != (_Manager_type)0x0) {
      local_1b8._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(this->completion_).super__Function_base._M_functor;
      local_1b8._8_8_ =
           *(undefined8 *)((long)&(this->completion_).super__Function_base._M_functor + 8);
      (this->completion_).super__Function_base._M_manager = (_Manager_type)0x0;
      (this->completion_)._M_invoker = (_Invoker_type)0x0;
      local_1a8 = p_Var3;
    }
    (_Var2._M_head_impl)->request_type_ = RVar1;
    Request::SetRequestType(_Var2._M_head_impl);
    std::function<void_(const_restincurl::Result_&)>::operator=
              (&(_Var2._M_head_impl)->completion_,
               (function<void_(const_restincurl::Result_&)> *)&local_1b8);
    if (local_1a8 != (_Manager_type)0x0) {
      (*local_1a8)(&local_1b8,&local_1b8,__destroy_functor);
    }
    this->is_built_ = true;
  }
  return;
}

Assistant:

void Build() {
            if (!is_built_) {
                // Set up Data Handlers
                if (!have_data_in_) {
                    // Use a default std::string. We expect json anyway...
                    this->StoreData(request_->getDefaultInBuffer());
                }

                if (have_data_out_) {
                    options_->Set(CURLOPT_UPLOAD, 1L);
                }

                if (request_timeout_ >= 0) {
                    options_->Set(CURLOPT_TIMEOUT_MS, request_timeout_);
                }

                if (connect_timeout_ >= 0) {
                    options_->Set(CURLOPT_CONNECTTIMEOUT_MS, connect_timeout_);
                }

                // Set headers
                if (request_->GetHeaders()) {
                    options_->Set(CURLOPT_HTTPHEADER, request_->GetHeaders());
                }

                // TODO: Prepare the final url (we want nice, correctly encoded request arguments)
                options_->Set(CURLOPT_URL, url_);
                RESTINCURL_LOG("Preparing connect to: " << url_);

                // Prepare request
                request_->Prepare(request_type_, std::move(completion_));
                is_built_ = true;
            }
        }